

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Err.cpp
# Opt level: O3

void __thiscall anon_unknown.dwarf_4527eb::DefaultErrStreamBuf::sync(DefaultErrStreamBuf *this)

{
  void *__ptr;
  
  __ptr = *(void **)&this->field_0x20;
  if (__ptr != *(void **)&this->field_0x28) {
    fwrite(__ptr,1,(long)*(void **)&this->field_0x28 - (long)__ptr,_stderr);
    *(undefined8 *)&this->field_0x28 = *(undefined8 *)&this->field_0x20;
  }
  return;
}

Assistant:

virtual int sync()
    {
        // Check if there is something into the write buffer
        if (pbase() != pptr())
        {
            // Print the contents of the write buffer into the standard error output
            std::size_t size = static_cast<std::size_t>(pptr() - pbase());
            fwrite(pbase(), 1, size, stderr);

            // Reset the pointer position to the beginning of the write buffer
            setp(pbase(), epptr());
        }

        return 0;
    }